

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UnicodeFullTest_starts_with_Test<std::pair<char32_t,_char>_>::UnicodeFullTest_starts_with_Test
          (UnicodeFullTest_starts_with_Test<std::pair<char32_t,_char>_> *this)

{
  UnicodeFullTest_starts_with_Test<std::pair<char32_t,_char>_> *this_local;
  
  UnicodeFullTest<std::pair<char32_t,_char>_>::UnicodeFullTest
            (&this->super_UnicodeFullTest<std::pair<char32_t,_char>_>);
  *(undefined ***)&this->super_UnicodeFullTest<std::pair<char32_t,_char>_> =
       &PTR__UnicodeFullTest_starts_with_Test_00815db0;
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, starts_with) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	// TypeParam::first_type starts_with TypeParam::second_type... (always false)
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCDzz")));

	// TypeParam::first_type... starts_with TypeParam::second_type (always same results as first)
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));
}